

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void P_MarkWorldVarStrings(void)

{
  ulong local_10;
  size_t i;
  
  ACSStringPool::MarkStringArray(&GlobalACSStrings,ACS_WorldVars,0x100);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    ACSStringPool::MarkStringMap(&GlobalACSStrings,ACS_WorldArrays + local_10);
  }
  return;
}

Assistant:

void P_MarkWorldVarStrings()
{
	GlobalACSStrings.MarkStringArray(ACS_WorldVars, countof(ACS_WorldVars));
	for (size_t i = 0; i < countof(ACS_WorldArrays); ++i)
	{
		GlobalACSStrings.MarkStringMap(ACS_WorldArrays[i]);
	}
}